

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.h
# Opt level: O0

void __thiscall DeviceTy::DeviceTy(DeviceTy *this,DeviceTy *d)

{
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *in_RSI;
  undefined4 *in_RDI;
  map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  *in_stack_ffffffffffffffa8;
  map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  *in_stack_ffffffffffffffb0;
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *in_stack_ffffffffffffffe8;
  
  *in_RDI = *(undefined4 *)
             &(in_RSI->super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>).
              _M_impl._M_node.super__List_node_base._M_next;
  *(_List_node_base **)(in_RDI + 2) =
       (in_RSI->super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>)._M_impl.
       _M_node.super__List_node_base._M_prev;
  in_RDI[4] = (int)(in_RSI->
                   super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>).
                   _M_impl._M_node._M_size;
  *(byte *)(in_RDI + 5) =
       *(byte *)((long)&(in_RSI->
                        super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>).
                        _M_impl._M_node._M_size + 4) & 1;
  in_RDI[6] = 0;
  std::once_flag::once_flag((once_flag *)(in_RDI + 6));
  *(byte *)(in_RDI + 7) =
       *(byte *)((long)&in_RSI[1].
                        super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>.
                        _M_impl._M_node.super__List_node_base._M_next + 4) & 1;
  std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::list
            (in_RSI,in_stack_ffffffffffffffe8);
  std::
  map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
  ::map((map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
         *)in_stack_ffffffffffffffb0,
        (map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
         *)in_stack_ffffffffffffffa8);
  std::
  map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  ::map(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  memset(in_RDI + 0x26,0,0x28);
  std::mutex::mutex((mutex *)0x10dbe1);
  memset(in_RDI + 0x30,0,0x28);
  std::mutex::mutex((mutex *)0x10dc08);
  memset(in_RDI + 0x3a,0,0x28);
  std::mutex::mutex((mutex *)0x10dc2f);
  *(_List_node_base **)(in_RDI + 0x44) =
       in_RSI[0xb].super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl
       ._M_node.super__List_node_base._M_prev;
  return;
}

Assistant:

DeviceTy(const DeviceTy &d)
      : DeviceID(d.DeviceID), RTL(d.RTL), RTLDeviceID(d.RTLDeviceID),
        IsInit(d.IsInit), InitFlag(), HasPendingGlobals(d.HasPendingGlobals),
        HostDataToTargetMap(d.HostDataToTargetMap),
        PendingCtorsDtors(d.PendingCtorsDtors), ShadowPtrMap(d.ShadowPtrMap),
        DataMapMtx(), PendingGlobalsMtx(),
        ShadowMtx(), loopTripCnt(d.loopTripCnt) {}